

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_objects.cc
# Opt level: O1

shared_ptr<QPDFObject> * __thiscall QPDF::resolve(QPDF *this,QPDFObjGen og)

{
  _Head_base<0UL,_QPDF::Members_*,_false> _Var1;
  bool bVar2;
  int iVar3;
  const_iterator cVar4;
  QPDFObjGen *pQVar5;
  const_iterator cVar6;
  mapped_type *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var7;
  mapped_type *pmVar8;
  string *description;
  QPDFExc *__return_storage_ptr__;
  long *plVar9;
  element_type *peVar10;
  QPDFObjGen QVar11;
  pair<std::_Rb_tree_iterator<QPDFObjGen>,_bool> pVar12;
  QPDFObjGen og_local;
  QPDFObjectHandle oh;
  undefined1 local_158 [16];
  QPDFObjGen a_og;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_138;
  string local_128;
  ResolveRecorder rr;
  undefined1 local_b0 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_a8;
  _Variadic_union<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
  local_a0 [2];
  
  og_local = og;
  bVar2 = isUnresolved(this,og);
  _Var1._M_head_impl =
       (this->m)._M_t.super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>._M_t
       .super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
       super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl;
  if (bVar2) {
    cVar4 = std::
            _Rb_tree<QPDFObjGen,_QPDFObjGen,_std::_Identity<QPDFObjGen>,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>
            ::find(&((_Var1._M_head_impl)->resolving)._M_t,&og_local);
    if ((_Rb_tree_header *)cVar4._M_node ==
        (_Rb_tree_header *)((long)&(_Var1._M_head_impl)->resolving + 8U)) {
      rr._vptr_ResolveRecorder = (_func_int **)&PTR__ResolveRecorder_002f3b78;
      rr.qpdf = this;
      pVar12 = std::
               _Rb_tree<QPDFObjGen,QPDFObjGen,std::_Identity<QPDFObjGen>,std::less<QPDFObjGen>,std::allocator<QPDFObjGen>>
               ::_M_insert_unique<QPDFObjGen_const&>
                         ((_Rb_tree<QPDFObjGen,QPDFObjGen,std::_Identity<QPDFObjGen>,std::less<QPDFObjGen>,std::allocator<QPDFObjGen>>
                           *)&((this->m)._M_t.
                               super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>
                               .super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl)->
                              resolving,&og_local);
      rr.iter._M_node = (_Base_ptr)pVar12.first._M_node;
      _Var1._M_head_impl =
           (this->m)._M_t.super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>.
           _M_t.super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
           super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl;
      cVar6 = std::
              _Rb_tree<QPDFObjGen,_std::pair<const_QPDFObjGen,_QPDFXRefEntry>,_std::_Select1st<std::pair<const_QPDFObjGen,_QPDFXRefEntry>_>,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_QPDFXRefEntry>_>_>
              ::find(&((_Var1._M_head_impl)->xref_table)._M_t,&og_local);
      if (cVar6._M_node != (_Base_ptr)((long)&(_Var1._M_head_impl)->xref_table + 8U)) {
        this_00 = std::
                  map<QPDFObjGen,_QPDFXRefEntry,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_QPDFXRefEntry>_>_>
                  ::operator[](&((this->m)._M_t.
                                 super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>
                                 .super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl)->
                                xref_table,&og_local);
        iVar3 = QPDFXRefEntry::getType(this_00);
        if (iVar3 == 1) {
          description = (string *)QPDFXRefEntry::getOffset(this_00);
          a_og.obj = 0;
          a_og.gen = 0;
          local_a8._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          local_a0[0]._0_1_ = qpdf_e_success;
          local_b0 = (undefined1  [8])local_a0;
          readObjectAtOffset((QPDF *)&oh,SUB81(this,0),1,description,(QPDFObjGen)local_b0,
                             (QPDFObjGen *)og_local,SUB81(&a_og,0));
          if (local_b0 != (undefined1  [8])local_a0) {
            operator_delete((void *)local_b0,CONCAT71(local_a0[0]._1_7_,local_a0[0]._0_1_) + 1);
          }
          if (oh.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (oh.super_BaseHandle.obj.
                       super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
            ;
          }
        }
        else {
          if (iVar3 != 2) {
            __return_storage_ptr__ = (QPDFExc *)__cxa_allocate_exception(0x80);
            local_b0 = (undefined1  [8])local_a0;
            local_a8._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            local_a0[0]._0_1_ = qpdf_e_success;
            QPDFObjGen::unparse_abi_cxx11_(&local_128,&og_local,'/');
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &a_og,"object ",&local_128);
            plVar9 = (long *)std::__cxx11::string::append((char *)&a_og);
            oh.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr = (element_type *)*plVar9;
            peVar10 = (element_type *)(plVar9 + 2);
            if (oh.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr == peVar10) {
              local_158._0_8_ =
                   *(undefined8 *)
                    &(peVar10->value).
                     super__Variant_base<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                     .
                     super__Move_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                     .
                     super__Copy_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                     .
                     super__Move_ctor_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                     .
                     super__Copy_ctor_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                     .
                     super__Variant_storage_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
              ;
              local_158._8_8_ = plVar9[3];
              oh.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr = (element_type *)local_158;
            }
            else {
              local_158._0_8_ =
                   *(undefined8 *)
                    &(peVar10->value).
                     super__Variant_base<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                     .
                     super__Move_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                     .
                     super__Copy_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                     .
                     super__Move_ctor_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                     .
                     super__Copy_ctor_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                     .
                     super__Variant_storage_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
              ;
            }
            oh.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)plVar9[1];
            *plVar9 = (long)peVar10;
            plVar9[1] = 0;
            *(undefined1 *)(plVar9 + 2) = 0;
            damagedPDF(__return_storage_ptr__,this,(string *)local_b0,-1,(string *)&oh);
            __cxa_throw(__return_storage_ptr__,&QPDFExc::typeinfo,QPDFExc::~QPDFExc);
          }
          iVar3 = QPDFXRefEntry::getObjStreamNumber(this_00);
          resolveObjectsInStream(this,iVar3);
        }
      }
      bVar2 = isUnresolved(this,og_local);
      QVar11 = og_local;
      if (bVar2) {
        local_b0 = (undefined1  [8])0x0;
        p_Var7 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x70);
        p_Var7->_M_use_count = 1;
        p_Var7->_M_weak_count = 1;
        p_Var7->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_002efb38;
        *(undefined1 *)&p_Var7[4]._vptr__Sp_counted_base = 2;
        p_Var7[4]._M_use_count = 0;
        p_Var7[4]._M_weak_count = 0;
        p_Var7[5]._vptr__Sp_counted_base = (_func_int **)0x0;
        p_Var7[5]._M_use_count = 0;
        p_Var7[5]._M_weak_count = 0;
        p_Var7[6]._vptr__Sp_counted_base = (_func_int **)0x0;
        p_Var7[6]._M_use_count = -1;
        p_Var7[6]._M_weak_count = -1;
        local_b0 = (undefined1  [8])(p_Var7 + 1);
        local_a8._M_pi = p_Var7;
        updateCache(this,QVar11,(shared_ptr<QPDFObject> *)local_b0,-1,-1,true);
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var7);
      }
      pmVar8 = std::
               map<QPDFObjGen,_QPDF::ObjCache,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_QPDF::ObjCache>_>_>
               ::operator[](&((this->m)._M_t.
                              super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>
                              .super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl)->
                             obj_cache,&og_local);
      peVar10 = (pmVar8->object).super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      peVar10->qpdf = this;
      peVar10->og = og_local;
      ResolveRecorder::~ResolveRecorder(&rr);
      return &pmVar8->object;
    }
    oh.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_158._0_8_ = local_158._0_8_ & 0xffffffffffffff00;
    oh.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)local_158;
    QPDFObjGen::unparse_abi_cxx11_(&local_128,&og_local,' ');
    pQVar5 = (QPDFObjGen *)std::__cxx11::string::replace((ulong)&local_128,0,(char *)0x0,0x28329c);
    QVar11 = (QPDFObjGen)(pQVar5 + 2);
    if (*pQVar5 == QVar11) {
      local_138._M_allocated_capacity = *(undefined8 *)QVar11;
      local_138._8_8_ = pQVar5[3];
      a_og = (QPDFObjGen)&local_138;
    }
    else {
      local_138._M_allocated_capacity = *(undefined8 *)QVar11;
      a_og = *pQVar5;
    }
    *pQVar5 = QVar11;
    pQVar5[1].obj = 0;
    pQVar5[1].gen = 0;
    *(undefined1 *)&pQVar5[2].obj = 0;
    damagedPDF((QPDFExc *)local_b0,this,(string *)&oh,(string *)&a_og);
    warn(this,(QPDFExc *)local_b0);
    QPDFExc::~QPDFExc((QPDFExc *)local_b0);
    if (a_og != (QPDFObjGen)&local_138) {
      operator_delete((void *)a_og,local_138._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_128._M_dataplus._M_p != &local_128.field_2) {
      operator_delete(local_128._M_dataplus._M_p,
                      (ulong)(local_128.field_2._M_allocated_capacity + 1));
    }
    if (oh.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
        (element_type *)local_158) {
      operator_delete(oh.super_BaseHandle.obj.
                      super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                      local_158._0_8_ + 1);
    }
    QVar11 = og_local;
    local_b0 = (undefined1  [8])0x0;
    p_Var7 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x70);
    p_Var7->_M_use_count = 1;
    p_Var7->_M_weak_count = 1;
    p_Var7->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_002efb38;
    *(undefined1 *)&p_Var7[4]._vptr__Sp_counted_base = 2;
    p_Var7[4]._M_use_count = 0;
    p_Var7[4]._M_weak_count = 0;
    p_Var7[5]._vptr__Sp_counted_base = (_func_int **)0x0;
    p_Var7[5]._M_use_count = 0;
    p_Var7[5]._M_weak_count = 0;
    p_Var7[6]._vptr__Sp_counted_base = (_func_int **)0x0;
    p_Var7[6]._M_use_count = -1;
    p_Var7[6]._M_weak_count = -1;
    local_b0 = (undefined1  [8])(p_Var7 + 1);
    local_a8._M_pi = p_Var7;
    updateCache(this,QVar11,(shared_ptr<QPDFObject> *)local_b0,-1,-1,true);
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var7);
    _Var1._M_head_impl =
         (this->m)._M_t.super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>.
         _M_t.super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
         super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl;
  }
  pmVar8 = std::
           map<QPDFObjGen,_QPDF::ObjCache,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_QPDF::ObjCache>_>_>
           ::operator[](&(_Var1._M_head_impl)->obj_cache,&og_local);
  return &pmVar8->object;
}

Assistant:

std::shared_ptr<QPDFObject> const&
QPDF::resolve(QPDFObjGen og)
{
    if (!isUnresolved(og)) {
        return m->obj_cache[og].object;
    }

    if (m->resolving.count(og)) {
        // This can happen if an object references itself directly or indirectly in some key that
        // has to be resolved during object parsing, such as stream length.
        QTC::TC("qpdf", "QPDF recursion loop in resolve");
        warn(damagedPDF("", "loop detected resolving object " + og.unparse(' ')));
        updateCache(og, QPDFObject::create<QPDF_Null>(), -1, -1);
        return m->obj_cache[og].object;
    }
    ResolveRecorder rr(this, og);

    if (m->xref_table.count(og) != 0) {
        QPDFXRefEntry const& entry = m->xref_table[og];
        try {
            switch (entry.getType()) {
            case 1:
                {
                    qpdf_offset_t offset = entry.getOffset();
                    // Object stored in cache by readObjectAtOffset
                    QPDFObjGen a_og;
                    QPDFObjectHandle oh = readObjectAtOffset(true, offset, "", og, a_og, false);
                }
                break;

            case 2:
                resolveObjectsInStream(entry.getObjStreamNumber());
                break;

            default:
                throw damagedPDF(
                    "", -1, ("object " + og.unparse('/') + " has unexpected xref entry type"));
            }
        } catch (QPDFExc& e) {
            warn(e);
        } catch (std::exception& e) {
            warn(damagedPDF(
                "", -1, ("object " + og.unparse('/') + ": error reading object: " + e.what())));
        }
    }

    if (isUnresolved(og)) {
        // PDF spec says unknown objects resolve to the null object.
        QTC::TC("qpdf", "QPDF resolve failure to null");
        updateCache(og, QPDFObject::create<QPDF_Null>(), -1, -1);
    }

    auto& result(m->obj_cache[og].object);
    result->setDefaultDescription(this, og);
    return result;
}